

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_document_set_anchor_internal(fy_document *fyd,fy_node *fyn,char *text,size_t len,uint flags)

{
  void *pvVar1;
  _Bool _Var2;
  bool bVar3;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar4;
  undefined1 local_e0 [8];
  fy_diag_report_ctx _drc;
  ulong uStack_b0;
  int rc;
  size_t origlen;
  char *origtext;
  char *data_copy;
  fy_atom handle;
  fy_accel_entry *xle;
  fy_token *fyt;
  fy_input *fyi;
  fy_anchor *fyam;
  fy_anchor *fya;
  _Bool malloced;
  _Bool copy;
  size_t sStack_30;
  uint flags_local;
  size_t len_local;
  char *text_local;
  fy_node *fyn_local;
  fy_document *fyd_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  bVar3 = (flags & 2) != 0;
  fyt = (fy_token *)0x0;
  xle = (fy_accel_entry *)0x0;
  origtext = (char *)0x0;
  if (((fyd == (fy_document *)0x0) || (fyn == (fy_node *)0x0)) || (fyn->fyd != fyd)) {
    return -1;
  }
  sStack_30 = len;
  if ((text != (char *)0x0) && (len == 0xffffffffffffffff)) {
    sStack_30 = strlen(text);
  }
  fyam = fy_document_lookup_anchor_by_node(fyd,fyn);
  if (text == (char *)0x0) {
    if (fyam != (fy_anchor *)0x0) {
      return 0;
    }
    fy_anchor_list_del(&fyd->anchors,(fy_anchor *)0x0);
    _Var2 = fy_document_is_accelerated(fyd);
    if (_Var2) {
      handle._48_8_ = fy_accel_entry_lookup_key_value(fyd->axl,pvRam0000000000000018,(void *)0x0);
      fy_accel_entry_remove(fyd->axl,(fy_accel_entry *)handle._48_8_);
      handle._48_8_ = fy_accel_entry_lookup_key_value(fyd->naxl,pvRam0000000000000010,(void *)0x0);
      fy_accel_entry_remove(fyd->naxl,(fy_accel_entry *)handle._48_8_);
    }
    fy_anchor_destroy((fy_anchor *)0x0);
    return 0;
  }
  if (fyam == (fy_anchor *)0x0) {
    if ((flags & 1) == 0) {
      origtext = text;
      if (!bVar3) {
        origtext = (char *)0x0;
      }
    }
    else {
      origtext = (char *)malloc(sStack_30);
      if (origtext == (char *)0x0) {
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0xb3,"fy_document_set_anchor_internal","malloc() failed");
        goto LAB_00124afe;
      }
      memcpy(origtext,text,sStack_30);
      fy_input_from_malloc_data(origtext,sStack_30,(fy_atom *)&data_copy,true);
    }
    if (origtext == (char *)0x0) {
      fyt = (fy_token *)fy_input_from_data(text,sStack_30,(fy_atom *)&data_copy,true);
    }
    else {
      fyt = (fy_token *)fy_input_from_malloc_data(text,sStack_30,(fy_atom *)&data_copy,true);
    }
    if (fyt == (fy_token *)0x0) {
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xc0,"fy_document_set_anchor_internal","fy_input_from_data() failed");
    }
    else {
      origtext = (char *)0x0;
      if ((((handle.fyi._4_4_ >> 0x15 & 1) != 0) &&
          (xle = (fy_accel_entry *)fy_token_create(FYTT_ANCHOR,&data_copy),
          (fy_token *)xle != (fy_token *)0x0)) &&
         (fyam = fy_anchor_create(fyd,fyn,(fy_token *)xle), fyam != (fy_anchor *)0x0)) {
        fy_anchor_list_add(&fyd->anchors,fyam);
        _Var2 = fy_document_is_accelerated(fyd);
        if (_Var2) {
          handle._48_8_ = fy_accel_entry_lookup(fyd->axl,fyam->anchor);
          if ((fy_accel_entry *)handle._48_8_ != (fy_accel_entry *)0x0) {
            pvVar1 = ((fy_accel_entry *)handle._48_8_)->value;
            if ((*(byte *)((long)pvVar1 + 0x20) & 1) == 0) {
              *(byte *)((long)pvVar1 + 0x20) = *(byte *)((long)pvVar1 + 0x20) & 0xfe | 1;
            }
            fyam->field_0x20 = fyam->field_0x20 & 0xfe | 1;
            fy_document_diag(fyd,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0xd9,"fy_document_set_anchor_internal",
                             "register anchor %.*s is multiple",CONCAT44(uVar4,(int)sStack_30),text)
            ;
          }
          handle._48_8_ = fy_accel_entry_insert(fyd->axl,fyam->anchor,fyam);
          if ((fy_accel_entry *)handle._48_8_ == (fy_accel_entry *)0x0) {
            fy_document_diag(fyd,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                             ,0xde,"fy_document_set_anchor_internal",
                             "fy_accel_entry_insert() fyd->axl failed");
            goto LAB_00124afe;
          }
        }
        _Var2 = fy_document_is_accelerated(fyd);
        if (!_Var2) {
LAB_00124aec:
          fy_input_unref((fy_input *)fyt);
          return 0;
        }
        _drc.override_column = fy_accel_insert(fyd->naxl,fyn,fyam);
        if (_drc.override_column == 0) {
          _drc.override_column = 0;
          goto LAB_00124aec;
        }
        fy_document_diag(fyd,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0xe4,"fy_document_set_anchor_internal",
                         "fy_accel_insert() fyd->naxl failed");
        goto LAB_00124b08;
      }
    }
  }
  else {
    origlen = (size_t)fy_token_get_text(fyam->anchor,&stack0xffffffffffffff50);
    if ((char *)origlen == (char *)0x0) {
      fy_document_diag(fyd,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xa5,"fy_document_set_anchor_internal","fy_token_get_text() failed");
    }
    else {
      memset(local_e0,0,0x28);
      local_e0._0_4_ = FYET_ERROR;
      local_e0._4_4_ = FYEM_DOC;
      _drc._0_8_ = fy_node_token(fyn);
      fy_document_diag_report
                (fyd,(fy_diag_report_ctx *)local_e0,
                 "cannot set anchor %.*s (anchor %.*s already exists)",sStack_30 & 0xffffffff,text,
                 uStack_b0 & 0xffffffff,origlen);
      if ((bVar3) && (text != (char *)0x0)) {
        free(text);
      }
      fyam = (fy_anchor *)0x0;
    }
  }
LAB_00124afe:
  _drc.override_column = -1;
LAB_00124b08:
  if (origtext != (char *)0x0) {
    free(origtext);
  }
  fy_anchor_destroy(fyam);
  fy_token_unref((fy_token *)xle);
  fy_input_unref((fy_input *)fyt);
  fyd->diag->field_0x3c = fyd->diag->field_0x3c & 0xfe;
  return _drc.override_column;
}

Assistant:

static int fy_document_set_anchor_internal(struct fy_document *fyd, struct fy_node *fyn, const char *text, size_t len,
                                           unsigned int flags) {
    const bool copy = !!(flags & FYDSAF_COPY);
    const bool malloced = !!(flags & FYDSAF_MALLOCED);
    struct fy_anchor *fya = NULL, *fyam = NULL;
    struct fy_input *fyi = NULL;
    struct fy_token *fyt = NULL;
    struct fy_accel_entry *xle;
    struct fy_atom handle;
    char *data_copy = NULL;
    const char *origtext;
    size_t origlen;
    int rc;

    if (!fyd || !fyn || fyn->fyd != fyd)
        return -1;

    if (text && len == (size_t) -1)
        len = strlen(text);

    fya = fy_document_lookup_anchor_by_node(fyd, fyn);

    if (!text) {
        /* no anchor, and trying to delete? OK */
        if (fya)
            return 0;
        /* remove the anchor */
        fy_anchor_list_del(&fyd->anchors, fya);

        if (fy_document_is_accelerated(fyd)) {
            xle = fy_accel_entry_lookup_key_value(fyd->axl, fya->anchor, fya);
            fy_accel_entry_remove(fyd->axl, xle);

            xle = fy_accel_entry_lookup_key_value(fyd->naxl, fya->fyn, fya);
            fy_accel_entry_remove(fyd->naxl, xle);
        }

        fy_anchor_destroy(fya);
        return 0;
    }

    /* trying to add duplicate anchor */
    if (fya) {
        origtext = fy_token_get_text(fya->anchor, &origlen);
        fyd_error_check(fyd, origtext, err_out,
                        "fy_token_get_text() failed");

        FYD_NODE_ERROR(fyd, fyn, FYEM_DOC,
                       "cannot set anchor %.*s (anchor %.*s already exists)",
                       (int) len, text, (int) origlen, origtext);
        if (malloced && text)
            free((void *) text);
        fya = NULL;
        goto err_out;
    }

    if (copy) {
        data_copy = malloc(len);
        fyd_error_check(fyd, data_copy, err_out,
                        "malloc() failed");
        memcpy(data_copy, text, len);
        fyi = fy_input_from_malloc_data(data_copy, len, &handle, true);
    } else if (malloced)
        data_copy = (char *) text;
    else
        data_copy = NULL;

    if (data_copy)
        fyi = fy_input_from_malloc_data((void *) text, len, &handle, true);
    else
        fyi = fy_input_from_data(text, len, &handle, true);
    fyd_error_check(fyd, fyi, err_out,
                    "fy_input_from_data() failed");
    data_copy = NULL;

    /* it must not be something funky */
    if (!handle.valid_anchor)
        goto err_out;

    fyt = fy_token_create(FYTT_ANCHOR, &handle);
    if (!fyt)
        goto err_out;

    fya = fy_anchor_create(fyd, fyn, fyt);
    if (!fya)
        goto err_out;

    fy_anchor_list_add(&fyd->anchors, fya);
    if (fy_document_is_accelerated(fyd)) {
        xle = fy_accel_entry_lookup(fyd->axl, fya->anchor);
        if (xle) {
            fyam = (void *) xle->value;
            /* multiple */
            if (!fyam->multiple)
                fyam->multiple = true;
            fya->multiple = true;

            fyd_notice(fyd, "register anchor %.*s is multiple", (int) len, text);
        }

        xle = fy_accel_entry_insert(fyd->axl, fya->anchor, fya);
        fyd_error_check(fyd, xle, err_out,
                        "fy_accel_entry_insert() fyd->axl failed");
    }

    if (fy_document_is_accelerated(fyd)) {
        rc = fy_accel_insert(fyd->naxl, fyn, fya);
        fyd_error_check(fyd, !rc, err_out_rc,
                        "fy_accel_insert() fyd->naxl failed");
    }

    /* take away the input reference */
    fy_input_unref(fyi);

    return 0;
    err_out:
    rc = -1;
    err_out_rc:
    if (data_copy)
        free(data_copy);
    fy_anchor_destroy(fya);
    fy_token_unref(fyt);
    fy_input_unref(fyi);
    fyd->diag->on_error = false;
    return rc;
}